

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O0

vm_obj_id_t CVmObjWeakRefLookupTable::create(int in_root_set,uint bucket_count,uint init_capacity)

{
  vm_obj_id_t vVar1;
  int in_EDX;
  undefined4 in_ESI;
  undefined4 in_EDI;
  CVmObjWeakRefLookupTable *unaff_retaddr;
  vm_obj_id_t id;
  vm_obj_id_t in_stack_ffffffffffffffec;
  int in_stack_fffffffffffffff0;
  
  vVar1 = vm_new_id(in_EDX,in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
  CVmObject::operator_new(CONCAT44(in_EDX,vVar1),in_stack_ffffffffffffffec);
  CVmObjWeakRefLookupTable(unaff_retaddr,CONCAT44(in_EDI,in_ESI),CONCAT44(in_EDX,vVar1));
  return vVar1;
}

Assistant:

vm_obj_id_t CVmObjWeakRefLookupTable::
   create(VMG_ int in_root_set, uint bucket_count, uint init_capacity)
{
    vm_obj_id_t id;

    /* allocate the object ID */
    id = vm_new_id(vmg_ in_root_set, TRUE, TRUE);

    /* create the object */
    new (vmg_ id) CVmObjWeakRefLookupTable(vmg_ bucket_count, init_capacity);

    /* return the new ID */
    return id;
}